

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O3

ostream * pstack::operator<<(ostream *os,JSON<std::shared_ptr<pstack::Dwarf::Unit>,_char> *unit)

{
  undefined1 auVar1 [8];
  JObject *pJVar2;
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *puVar3;
  Macros *v;
  DIE local_60;
  uint local_38;
  uint local_34;
  undefined1 local_30 [8];
  JObject fmt;
  
  fmt.os = (ostream *)0x168abe;
  local_30 = (undefined1  [8])os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  fmt.sep._1_1_ = 0;
  pJVar2 = JObject::field<char[7],unsigned_int,char>
                     ((JObject *)local_30,(char (*) [7])0x167841,
                      &((unit->object->
                        super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->length,(char *)((long)&fmt.sep + 1));
  fmt.sep._2_1_ = 0;
  pJVar2 = JObject::field<char[7],unsigned_long,char>
                     (pJVar2,(char (*) [7])0x167699,
                      &((unit->object->
                        super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->offset,(char *)((long)&fmt.sep + 2));
  local_38 = (uint)((unit->object->
                    super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   version;
  fmt.sep._3_1_ = 0;
  pJVar2 = JObject::field<char[8],int,char>
                     (pJVar2,(char (*) [8])0x1678eb,(int *)&local_38,(char *)((long)&fmt.sep + 3));
  local_34 = (uint)((unit->object->
                    super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   addrlen;
  fmt.sep._4_1_ = 0;
  pJVar2 = JObject::field<char[8],int,char>
                     (pJVar2,(char (*) [8])"addrlen",(int *)&local_34,(char *)((long)&fmt.sep + 4));
  fmt.sep._5_1_ = 0;
  pJVar2 = JObject::field<char[3],std::array<unsigned_char,8ul>,char>
                     (pJVar2,(char (*) [3])0x167601,
                      &((unit->object->
                        super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->id,(char *)((long)&fmt.sep + 5));
  fmt.sep._6_1_ = 0;
  pJVar2 = JObject::field<char[9],pstack::Dwarf::UnitType,char>
                     (pJVar2,(char (*) [9])"unitType",
                      &((unit->object->
                        super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->unitType,(char *)((long)&fmt.sep + 6));
  Dwarf::Unit::root(&local_60,
                    (unit->object->
                    super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  fmt.sep._7_1_ = 0;
  JObject::field<char[8],pstack::Dwarf::DIE,char>
            (pJVar2,(char (*) [8])"dietree",&local_60,(char *)((long)&fmt.sep + 7));
  Dwarf::DIE::~DIE(&local_60);
  puVar3 = Dwarf::Unit::getLines
                     ((unit->object->
                      super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if ((puVar3->_M_t).
      super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>.
      _M_t.
      super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>
      .super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl != (LineInfo *)0x0) {
    puVar3 = Dwarf::Unit::getLines
                       ((unit->object->
                        super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    local_60.offset._0_1_ = 0;
    JObject::field<char[12],pstack::Dwarf::LineInfo,char>
              ((JObject *)local_30,(char (*) [12])"linenumbers",
               (puVar3->_M_t).
               super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>
               .super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl,
               (char *)&local_60);
  }
  v = Dwarf::Unit::getMacros
                ((unit->object->super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr);
  if (v != (Macros *)0x0) {
    local_60.offset._0_1_ = 0;
    JObject::field<char[7],pstack::Dwarf::Macros,char>
              ((JObject *)local_30,(char (*) [7])0x1671e9,v,(char *)&local_60);
  }
  Dwarf::Unit::purge((unit->object->
                     super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  auVar1 = local_30;
  JObject::~JObject((JObject *)local_30);
  return (ostream *)auVar1;
}

Assistant:

std::ostream &operator << (std::ostream &os, const JSON<Dwarf::Unit::sptr> &unit) {
    JObject fmt(os);

    fmt.field("length", unit.object->length)
        .field("offset",  unit.object->offset)
        .field("version", int(unit.object->version))
        .field("addrlen", int(unit.object->addrlen))
        .field("id", unit.object->id)
        .field("unitType", unit.object->unitType)
        .field("dietree", unit.object->root());
    if (unit.object->getLines() != nullptr)
        fmt.field("linenumbers", *unit.object->getLines());

    auto macros = unit.object->getMacros();
    if (macros)
        fmt.field("macros", *macros);
    unit.object->purge();
    return fmt;
}